

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O2

void roaring_bitmap_and_inplace(roaring_bitmap_t *x1,roaring_bitmap_t *x2)

{
  byte type1;
  uint16_t x;
  ushort x_00;
  int iVar1;
  container_t *c1;
  uint8_t uVar2;
  _Bool _Var3;
  uint uVar4;
  uint pos;
  container_t *c;
  long lVar5;
  int pos_00;
  ulong uVar6;
  ulong uVar7;
  uint8_t result_type;
  uint local_50;
  int local_4c;
  roaring_array_t *local_48;
  int32_t local_3c;
  container_t *local_38;
  
  if (x1 == x2) {
    return;
  }
  iVar1 = (x1->high_low_container).size;
  local_3c = (x2->high_low_container).size;
  local_4c = 0;
  uVar6 = 0;
  pos = 0;
  local_48 = &x2->high_low_container;
LAB_00117b1d:
  do {
    uVar7 = uVar6 & 0xffff;
    while( true ) {
      if ((iVar1 <= (int)pos) || (pos_00 = (int)uVar6, local_3c <= pos_00)) {
        for (lVar5 = (long)(int)pos; lVar5 < iVar1; lVar5 = lVar5 + 1) {
          container_free((x1->high_low_container).containers[lVar5],
                         (x1->high_low_container).typecodes[lVar5]);
        }
        (x1->high_low_container).size = local_4c;
        return;
      }
      uVar4 = pos & 0xffff;
      x = (x1->high_low_container).keys[uVar4];
      x_00 = local_48->keys[uVar7];
      if (x == x_00) {
        type1 = (x1->high_low_container).typecodes[uVar4];
        c1 = (x1->high_low_container).containers[uVar4];
        local_50 = (uint)type1;
        if (type1 == 4) {
          c = container_and(c1,'\x04',local_48->containers[uVar7],local_48->typecodes[uVar7],
                            &result_type);
        }
        else {
          c = container_iand(c1,type1,local_48->containers[uVar7],local_48->typecodes[uVar7],
                             &result_type);
        }
        if (c != c1) {
          container_free(c1,(uint8_t)local_50);
        }
        uVar2 = result_type;
        local_50 = (uint)result_type;
        local_38 = c;
        _Var3 = container_nonzero_cardinality(c,result_type);
        if (_Var3) {
          lVar5 = (long)local_4c;
          (x1->high_low_container).keys[lVar5] = x;
          (x1->high_low_container).containers[lVar5] = local_38;
          (x1->high_low_container).typecodes[lVar5] = uVar2;
          local_4c = local_4c + 1;
        }
        else {
          container_free(local_38,(uint8_t)local_50);
        }
        pos = pos + 1;
        uVar6 = (ulong)(pos_00 + 1);
        goto LAB_00117b1d;
      }
      if (x_00 <= x) break;
      pos = ra_advance_until_freeing(&x1->high_low_container,x_00,pos);
    }
    uVar4 = ra_advance_until(local_48,x,pos_00);
    uVar6 = (ulong)uVar4;
  } while( true );
}

Assistant:

void roaring_bitmap_and_inplace(roaring_bitmap_t *x1,
                                const roaring_bitmap_t *x2) {
    if (x1 == x2) return;
    int pos1 = 0, pos2 = 0, intersection_size = 0;
    const int length1 = ra_get_size(&x1->high_low_container);
    const int length2 = ra_get_size(&x2->high_low_container);

    // any skipped-over or newly emptied containers in x1
    // have to be freed.
    while (pos1 < length1 && pos2 < length2) {
        const uint16_t s1 =
            ra_get_key_at_index(&x1->high_low_container, (uint16_t)pos1);
        const uint16_t s2 =
            ra_get_key_at_index(&x2->high_low_container, (uint16_t)pos2);

        if (s1 == s2) {
            uint8_t type1, type2, result_type;
            container_t *c1 = ra_get_container_at_index(&x1->high_low_container,
                                                        (uint16_t)pos1, &type1);
            container_t *c2 = ra_get_container_at_index(&x2->high_low_container,
                                                        (uint16_t)pos2, &type2);

            // We do the computation "in place" only when c1 is not a shared
            // container. Rationale: using a shared container safely with in
            // place computation would require making a copy and then doing the
            // computation in place which is likely less efficient than avoiding
            // in place entirely and always generating a new container.
            container_t *c =
                (type1 == SHARED_CONTAINER_TYPE)
                    ? container_and(c1, type1, c2, type2, &result_type)
                    : container_iand(c1, type1, c2, type2, &result_type);

            if (c != c1) {  // in this instance a new container was created, and
                            // we need to free the old one
                container_free(c1, type1);
            }
            if (container_nonzero_cardinality(c, result_type)) {
                ra_replace_key_and_container_at_index(&x1->high_low_container,
                                                      intersection_size, s1, c,
                                                      result_type);
                intersection_size++;
            } else {
                container_free(c, result_type);
            }
            ++pos1;
            ++pos2;
        } else if (s1 < s2) {
            pos1 = ra_advance_until_freeing(&x1->high_low_container, s2, pos1);
        } else {  // s1 > s2
            pos2 = ra_advance_until(&x2->high_low_container, s1, pos2);
        }
    }

    // if we ended early because x2 ran out, then all remaining in x1 should be
    // freed
    while (pos1 < length1) {
        container_free(x1->high_low_container.containers[pos1],
                       x1->high_low_container.typecodes[pos1]);
        ++pos1;
    }

    // all containers after this have either been copied or freed
    ra_downsize(&x1->high_low_container, intersection_size);
}